

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O2

void dummy_Op_GetElementI_UInt32(void)

{
  return;
}

Assistant:

Var JavascriptOperators::OP_GetElementI_Int32(Var instance, int32 index, ScriptContext* scriptContext)
    {
        JIT_HELPER_REENTRANT_HEADER(Op_GetElementI_Int32);
#if FLOATVAR
        return OP_GetElementI_JIT(instance, Js::JavascriptNumber::ToVar(index, scriptContext), scriptContext);
#else
        char buffer[sizeof(Js::JavascriptNumber)];
        return OP_GetElementI_JIT(instance, Js::JavascriptNumber::ToVarInPlace(index, scriptContext,
            (Js::JavascriptNumber *)buffer), scriptContext);
#endif
        JIT_HELPER_END(Op_GetElementI_Int32);
    }